

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL> *
__thiscall
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::
get_extra_required_extension_names_abi_cxx11_
          (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *__return_storage_ptr__,ShaderSubgroupSupportHelper *this,Candidate c)

{
  long lVar1;
  allocator local_52;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((int)this == 8) {
    ::std::__cxx11::string::string((string *)&local_50,"GL_AMD_gpu_shader_int64",&local_52);
    ::std::__cxx11::string::string((string *)&local_30,"GL_NV_gpu_shader5",&local_51);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::SmallVector(__return_storage_ptr__,&local_50,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xfffffffffffffff0);
    lVar1 = 0x20;
    do {
      ::std::__cxx11::string::~string((string *)((long)&local_50._M_dataplus._M_p + lVar1));
      lVar1 = lVar1 + -0x20;
    } while (lVar1 != -0x20);
  }
  else if ((int)this == 6) {
    ::std::__cxx11::string::string((string *)&local_50,"GL_ARB_shader_int64",&local_52);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::SmallVector(__return_storage_ptr__,&local_50,&local_30);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    (__return_storage_ptr__->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size = 0;
    (__return_storage_ptr__->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallVector<std::string> CompilerGLSL::ShaderSubgroupSupportHelper::get_extra_required_extension_names(Candidate c)
{
	switch (c)
	{
	case ARB_shader_ballot:
		return { "GL_ARB_shader_int64" };
	case AMD_gcn_shader:
		return { "GL_AMD_gpu_shader_int64", "GL_NV_gpu_shader5" };
	default:
		return {};
	}
}